

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNearestNeighborsClassifierValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)404>(Result *__return_storage_ptr__,Model *format)

{
  uint32 uVar1;
  bool bVar2;
  uint32 uVar3;
  KNearestNeighborsClassifier *pKVar4;
  Int64Vector *pIVar5;
  StringVector *pSVar6;
  ostream *poVar7;
  Type *pTVar8;
  SingleKdTreeIndex *pSVar9;
  Int64Parameter *int64Parameter;
  int i;
  int iVar10;
  int iVar11;
  undefined1 in_R9B;
  NearestNeighborsIndex *this;
  string sStack_1f8;
  Result res;
  stringstream out;
  string local_1a8 [8];
  ostream local_1a0 [376];
  
  pKVar4 = Specification::Model::knearestneighborsclassifier(format);
  std::__cxx11::string::string((string *)&out,"numberOfNeighbors",(allocator *)&sStack_1f8);
  int64Parameter = pKVar4->numberofneighbors_;
  if (int64Parameter == (Int64Parameter *)0x0) {
    int64Parameter = (Int64Parameter *)&Specification::_Int64Parameter_default_instance_;
  }
  validateInt64Parameter(&res,(string *)&out,int64Parameter,true);
  std::__cxx11::string::~string((string *)&out);
  bVar2 = Result::good(&res);
  if (bVar2) {
    if (pKVar4->_oneof_case_[2] == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&out);
      poVar7 = std::operator<<(local_1a0,
                               "KNearestNeighborsClassifier requires a weighting scheme to be set.")
      ;
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1f8);
    }
    else {
      uVar3 = pKVar4->_oneof_case_[0];
      iVar10 = 0;
      iVar11 = 0;
      if (uVar3 == 0x65) {
        pIVar5 = Specification::KNearestNeighborsClassifier::int64classlabels(pKVar4);
        iVar11 = (pIVar5->vector_).current_size_;
        uVar3 = pKVar4->_oneof_case_[0];
      }
      if (uVar3 == 100) {
        pSVar6 = Specification::KNearestNeighborsClassifier::stringclasslabels(pKVar4);
        iVar10 = (pSVar6->vector_).super_RepeatedPtrFieldBase.current_size_;
        uVar3 = pKVar4->_oneof_case_[0];
      }
      if (iVar10 < iVar11) {
        iVar10 = iVar11;
      }
      uVar1 = pKVar4->_oneof_case_[1];
      if (uVar1 == 0) {
        if (iVar10 == 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&out);
          poVar7 = std::operator<<(local_1a0,
                                   "KNearestNeighborsClassifier should specify default class labels when class labels are not specified."
                                  );
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__cxx11::stringbuf::str();
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1f8);
        }
        else {
LAB_0055c380:
          bVar2 = false;
LAB_0055c383:
          pKVar4 = Specification::Model::knearestneighborsclassifier(format);
          validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::KNearestNeighborsClassifier>
                    ((Result *)&out,(CoreML *)format,(Model *)pKVar4,
                     (KNearestNeighborsClassifier *)0x1,bVar2,(bool)in_R9B);
          Result::operator=(&res,(Result *)&out);
          std::__cxx11::string::~string(local_1a8);
          bVar2 = Result::good(&res);
          if (!bVar2) goto LAB_0055c431;
          pKVar4 = Specification::Model::knearestneighborsclassifier(format);
          this = pKVar4->nearestneighborsindex_;
          if (this == (NearestNeighborsIndex *)0x0) {
            this = (NearestNeighborsIndex *)&Specification::_NearestNeighborsIndex_default_instance_
            ;
          }
          iVar11 = (this->floatsamples_).super_RepeatedPtrFieldBase.current_size_;
          if ((iVar10 == 0) || (iVar11 != 0)) {
            if (iVar11 == iVar10) {
              iVar11 = 0;
              do {
                if ((this->floatsamples_).super_RepeatedPtrFieldBase.current_size_ <= iVar11) {
                  if (this->_oneof_case_[0] != 100) {
                    if (this->_oneof_case_[0] != 0x6e) {
                      std::__cxx11::stringstream::stringstream((stringstream *)&out);
                      poVar7 = std::operator<<(local_1a0,
                                               "KNearestNeighborsClassifier has no index type specified."
                                              );
                      std::endl<char,std::char_traits<char>>(poVar7);
                      std::__cxx11::stringbuf::str();
                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1f8);
                      goto LAB_0055c59b;
                    }
                    pSVar9 = Specification::NearestNeighborsIndex::singlekdtreeindex(this);
                    if (pSVar9->leafsize_ < 1) {
                      std::__cxx11::stringstream::stringstream((stringstream *)&out);
                      poVar7 = std::operator<<(local_1a0,
                                               "KNearestNeighborsClassifier requires leaf size to be a positive integer."
                                              );
                      std::endl<char,std::char_traits<char>>(poVar7);
                      std::__cxx11::stringbuf::str();
                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1f8);
                      goto LAB_0055c59b;
                    }
                  }
                  if (this->_oneof_case_[1] != 0) {
                    Result::Result(__return_storage_ptr__);
                    goto LAB_0055c5ad;
                  }
                  std::__cxx11::stringstream::stringstream((stringstream *)&out);
                  poVar7 = std::operator<<(local_1a0,
                                           "KNearestNeighborsClassifier requires a distance function to be set."
                                          );
                  std::endl<char,std::char_traits<char>>(poVar7);
                  std::__cxx11::stringbuf::str();
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1f8);
                  goto LAB_0055c59b;
                }
                pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                                   (&(this->floatsamples_).super_RepeatedPtrFieldBase,iVar11);
                iVar11 = iVar11 + 1;
              } while ((pTVar8->vector_).current_size_ == this->numberofdimensions_);
              std::__cxx11::stringstream::stringstream((stringstream *)&out);
              poVar7 = std::operator<<(local_1a0,"Unexpected length \"");
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar7,
                                  (this->floatsamples_).super_RepeatedPtrFieldBase.current_size_);
              poVar7 = std::operator<<(poVar7,"\" given the provided number of dimensions \"");
              poVar7 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar7,this->numberofdimensions_);
              poVar7 = std::operator<<(poVar7,".");
              std::endl<char,std::char_traits<char>>(poVar7);
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1f8);
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)&out);
              poVar7 = std::operator<<(local_1a0,"Unexpected number of labels \"");
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar10);
              poVar7 = std::operator<<(poVar7,"\" for the given number of examples: \"");
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar7,
                                  (this->floatsamples_).super_RepeatedPtrFieldBase.current_size_);
              poVar7 = std::operator<<(poVar7,".");
              std::endl<char,std::char_traits<char>>(poVar7);
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1f8);
            }
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)&out);
            poVar7 = std::operator<<(local_1a0,"KNearestNeighborsClassifier has no data points.");
            std::endl<char,std::char_traits<char>>(poVar7);
            std::__cxx11::stringbuf::str();
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1f8);
          }
        }
      }
      else if (uVar1 == 0x6e) {
        bVar2 = false;
        if ((uVar3 == 0) || (uVar3 == 100)) goto LAB_0055c383;
        std::__cxx11::stringstream::stringstream((stringstream *)&out);
        poVar7 = std::operator<<(local_1a0,
                                 "KNearestNeighborsClassifier\'s class label and default class label have different types."
                                );
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1f8);
      }
      else {
        if (uVar1 != 0x6f) goto LAB_0055c380;
        bVar2 = true;
        if ((uVar3 == 0) || (uVar3 == 0x65)) goto LAB_0055c383;
        std::__cxx11::stringstream::stringstream((stringstream *)&out);
        poVar7 = std::operator<<(local_1a0,
                                 "KNearestNeighborsClassifier\'s class label and default class label have different types."
                                );
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1f8);
      }
    }
LAB_0055c59b:
    std::__cxx11::string::~string((string *)&sStack_1f8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  }
  else {
LAB_0055c431:
    Result::Result(__return_storage_ptr__,&res);
  }
LAB_0055c5ad:
  std::__cxx11::string::~string((string *)&res.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_kNearestNeighborsClassifier>(const Specification::Model& format) {

        const Specification::KNearestNeighborsClassifier& knnClassifier = format.knearestneighborsclassifier();

        Result res = validateInt64Parameter("numberOfNeighbors", knnClassifier.numberofneighbors(), true);
        if (!res.good()) {
            return res;
        }

        switch (knnClassifier.WeightingScheme_case()) {
            case Specification::KNearestNeighborsClassifier::kUniformWeighting:
            case Specification::KNearestNeighborsClassifier::kInverseDistanceWeighting:
                // Valid weighting scheme
                break;

            case Specification::KNearestNeighborsClassifier::WEIGHTINGSCHEME_NOT_SET:
                std::stringstream out;
                out << "KNearestNeighborsClassifier requires a weighting scheme to be set." << std::endl;
                return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
        }
        
        int intLabelCount = knnClassifier.has_int64classlabels() ? knnClassifier.int64classlabels().vector_size() : 0;
        int stringLabelCount = knnClassifier.has_stringclasslabels() ? knnClassifier.stringclasslabels().vector_size() : 0;
        
        int labelCount = MAX(intLabelCount, stringLabelCount);
        
        auto classLabelCase = knnClassifier.ClassLabels_case();
        auto defaultClassLabelIsInt64 = false;
        
        switch (knnClassifier.DefaultClassLabel_case()) {
            case Specification::KNearestNeighborsClassifier::kDefaultStringLabel:
                if (classLabelCase != Specification::KNearestNeighborsClassifier::CLASSLABELS_NOT_SET &&
                    classLabelCase != Specification::KNearestNeighborsClassifier::kStringClassLabels) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier's class label and default class label have different types." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
                defaultClassLabelIsInt64 = false;
                break;
                    
            case Specification::KNearestNeighborsClassifier::kDefaultInt64Label:
                if (classLabelCase != Specification::KNearestNeighborsClassifier::CLASSLABELS_NOT_SET &&
                    classLabelCase != Specification::KNearestNeighborsClassifier::kInt64ClassLabels) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier's class label and default class label have different types." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
                defaultClassLabelIsInt64 = true;
                break;
                
            case Specification::KNearestNeighborsClassifier::DEFAULTCLASSLABEL_NOT_SET:
                if (labelCount == 0) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier should specify default class labels when class labels are not specified." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
        }
        
        res = validateClassifierInterface(format, format.knearestneighborsclassifier(), true, defaultClassLabelIsInt64);
        if (!res.good()) {
            return res;
        }

        
        return validateNearestNeighborsIndex(format, labelCount);

    }